

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall mp::NLSolver::InitAutoStub(NLSolver *this)

{
  string *__rhs;
  NLUtils *pNVar1;
  uint uVar2;
  result_type rVar3;
  char *pcVar4;
  string local_27e0;
  path path;
  uniform_int_distribution<unsigned_long> rand;
  char local_2788 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2748;
  mt19937 prng;
  random_device dev;
  
  std::random_device::random_device(&dev);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&prng,(ulong)uVar2);
  rand._M_param._M_a = 0;
  rand._M_param._M_b = 0xffffffffffffffff;
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::operator/=(&path,(char (*) [6])"nlw2_");
  local_2788[8] = '\0';
  local_2788[9] = '\0';
  local_2788[10] = '\0';
  local_2788[0xb] = '\0';
  local_2788[0xc] = '\0';
  local_2788[0xd] = '\0';
  local_2788[0xe] = '\0';
  local_2788[0xf] = '\0';
  local_2788[0x30] = '\0';
  local_2788[0x31] = '\0';
  local_2788[0x32] = '\0';
  local_2788[0x33] = '\0';
  local_2788[0x34] = '\0';
  local_2788[0x35] = '\0';
  local_2788[0x36] = '\0';
  local_2788[0x37] = '\0';
  local_2788[0x38] = '\0';
  local_2788[0x39] = '\0';
  local_2788[0x3a] = '\0';
  local_2788[0x3b] = '\0';
  local_2788[0x3c] = '\0';
  local_2788[0x3d] = '\0';
  local_2788[0x3e] = '\0';
  local_2788[0x3f] = '\0';
  local_2788[0x20] = '\0';
  local_2788[0x21] = '\0';
  local_2788[0x22] = '\0';
  local_2788[0x23] = '\0';
  local_2788[0x24] = '\0';
  local_2788[0x25] = '\0';
  local_2788[0x26] = '\0';
  local_2788[0x27] = '\0';
  local_2788[0x28] = '\0';
  local_2788[0x29] = '\0';
  local_2788[0x2a] = '\0';
  local_2788[0x2b] = '\0';
  local_2788[0x2c] = '\0';
  local_2788[0x2d] = '\0';
  local_2788[0x2e] = '\0';
  local_2788[0x2f] = '\0';
  local_2788[0x10] = '\0';
  local_2788[0x11] = '\0';
  local_2788[0x12] = '\0';
  local_2788[0x13] = '\0';
  local_2788[0x14] = '\0';
  local_2788[0x15] = '\0';
  local_2788[0x16] = '\0';
  local_2788[0x17] = '\0';
  local_2788[0x18] = '\0';
  local_2788[0x19] = '\0';
  local_2788[0x1a] = '\0';
  local_2788[0x1b] = '\0';
  local_2788[0x1c] = '\0';
  local_2788[0x1d] = '\0';
  local_2788[0x1e] = '\0';
  local_2788[0x1f] = '\0';
  builtin_strncpy(local_2788,"rndhex",7);
  local_2788[7] = '\0';
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&rand,&prng);
  snprintf(local_2788,0x3f,"%lX",rVar3);
  std::filesystem::__cxx11::path::concat<char[64]>(&path,&local_2788);
  std::filesystem::__cxx11::path::operator+=(&path,"_XXXXXX");
  std::filesystem::__cxx11::path::string(&local_27e0,&path);
  __rhs = &this->pathstr_;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_27e0);
  std::__cxx11::string::~string((string *)&local_27e0);
  pcVar4 = mkdtemp((this->pathstr_)._M_dataplus._M_p);
  if (pcVar4 == (char *)0x0) {
    pNVar1 = this->p_ut_;
    std::operator+(&local_2748,"Could not create a temp dir\nfrom pattern \'",__rhs);
    std::operator+(&local_27e0,&local_2748,"\'");
    (*pNVar1->_vptr_NLUtils[7])(pNVar1,&local_27e0);
    std::__cxx11::string::~string((string *)&local_27e0);
    std::__cxx11::string::~string((string *)&local_2748);
  }
  std::filesystem::__cxx11::path::operator=(&path,__rhs);
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&rand,&prng);
  snprintf(local_2788,0x3f,"%lX",rVar3);
  std::filesystem::__cxx11::path::operator/=(&path,&local_2788);
  std::filesystem::__cxx11::path::string(&local_27e0,&path);
  std::__cxx11::string::operator=((string *)&this->filestub_,(string *)&local_27e0);
  std::__cxx11::string::~string((string *)&local_27e0);
  std::filesystem::__cxx11::path::~path(&path);
  std::random_device::~random_device(&dev);
  return;
}

Assistant:

void NLSolver::InitAutoStub() {
  // init file stub
  std::random_device dev;
  std::mt19937 prng(dev());
  std::uniform_int_distribution<unsigned long> rand(0);
  auto path = std::filesystem::temp_directory_path();
  path /= "nlw2_"; // via '/'
  char rnds[64] = "rndhex";
  std::snprintf(rnds, sizeof(rnds)-1, "%lX", rand(prng));
  path += rnds;    // no '/'

  path += "_XXXXXX";
  pathstr_ = path.string();

#if defined(_WIN32) || defined(_WIN64)
  auto p1 = _mktemp((char*)pathstr_.c_str());
  assert(p1);
  if (!std::filesystem::create_directory(pathstr_))
    Utils().myexit("Could not create temp dir '"
                   + pathstr_ + "'");
#else
  if (!mkdtemp((char*)pathstr_.c_str()))
    Utils().myexit("Could not create a temp dir\n"
                   "from pattern '" + pathstr_ + "'");
#endif
  path = pathstr_;
  // Plus filename
  std::snprintf(rnds, sizeof(rnds)-1, "%lX", rand(prng));
  path /= rnds;
  filestub_ = path.string();
}